

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall
QDockWidgetGroupWindow::hover(QDockWidgetGroupWindow *this,QLayoutItem *widgetItem,QPoint *mousePos)

{
  initializer_list<QDockAreaLayoutItem> args;
  bool bVar1;
  compare_eq_result_container<QList<int>,_int> cVar2;
  Int IVar3;
  QLayout *pQVar4;
  QDockAreaLayoutInfo *this_00;
  QSize QVar5;
  QDockAreaLayoutItem *pQVar6;
  long *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *group;
  TabMode tabMode;
  bool nestingEnabled;
  QDockAreaLayoutInfo *savedState;
  QList<int> newGapPos;
  DockOptions opts;
  QDockAreaLayoutInfo newState;
  undefined4 in_stack_fffffffffffffe98;
  DockOption in_stack_fffffffffffffe9c;
  QDockAreaLayoutInfo *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  iterator in_stack_fffffffffffffeb0;
  QDockAreaLayoutInfo *in_stack_fffffffffffffeb8;
  QDockWidgetGroupWindow *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 uVar7;
  QDockAreaLayoutItem *in_stack_fffffffffffffee8;
  QPoint *in_stack_fffffffffffffef0;
  undefined1 animate;
  QDockAreaLayoutInfo *this_01;
  bool local_d5;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_d4;
  undefined1 *local_d0;
  QDockAreaLayoutInfo *this_02;
  QLayoutItem *dockWidgetItem;
  undefined4 in_stack_ffffffffffffff48;
  Representation in_stack_ffffffffffffff4c;
  Representation in_stack_ffffffffffffff50;
  QFlagsStorage<QMainWindow::DockOption> in_stack_ffffffffffffff54;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_a8;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_a4;
  undefined1 local_a0 [88];
  byte local_48;
  undefined8 local_40;
  QDockAreaLayoutItem local_30;
  QLayoutItem *local_8;
  
  local_8 = *(QLayoutItem **)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar4 = QWidget::layout((QWidget *)0x5f1c42);
  bVar1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x5f1c57);
  if (bVar1) {
    layoutInfo((QDockWidgetGroupWindow *)0x5f1c67);
    QDockAreaLayoutInfo::operator=
              (in_stack_fffffffffffffea0,
               (QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
    ;
  }
  local_a4.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)0xaaaaaaaa;
  QWidget::parentWidget((QWidget *)0x5f1c8b);
  local_a4.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)
       QMainWindow::dockOptions((QMainWindow *)in_stack_fffffffffffffea0);
  memset(local_a0,0xaa,0x70);
  QDockAreaLayoutInfo::QDockAreaLayoutInfo
            (in_stack_fffffffffffffea0,
             (QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_a8.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)
       QFlags<QMainWindow::DockOption>::operator&
                 ((QFlags<QMainWindow::DockOption> *)in_stack_fffffffffffffea0,
                  in_stack_fffffffffffffe9c);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a8);
  uVar7 = false;
  if (IVar3 != 0) {
    in_stack_ffffffffffffff54.i =
         (Int)QFlags<QMainWindow::DockOption>::operator&
                        ((QFlags<QMainWindow::DockOption> *)in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffe9c);
    uVar7 = QFlags<QMainWindow::DockOption>::operator!
                      ((QFlags<QMainWindow::DockOption> *)&stack0xffffffffffffff54);
  }
  (**(code **)(*in_RSI + 0x68))();
  this_00 = (QDockAreaLayoutInfo *)qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5f1d58);
  if (this_00 != (QDockAreaLayoutInfo *)0x0) {
    tabLayoutInfo(in_stack_fffffffffffffec8);
  }
  animate = (undefined1)((ulong)in_RSI >> 0x38);
  if ((local_48 & 1) != 0) {
    in_stack_fffffffffffffeb8 = (QDockAreaLayoutInfo *)operator_new(0x70);
    QDockAreaLayoutInfo::QDockAreaLayoutInfo
              (in_stack_fffffffffffffea0,
               (QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
    ;
    QDockAreaLayoutItem::QDockAreaLayoutItem(&local_30,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffee8 = &local_30;
    in_stack_fffffffffffffef0 = (QPoint *)0x1;
    args._M_len = (size_type)in_stack_fffffffffffffeb8;
    args._M_array = in_stack_fffffffffffffeb0;
    QList<QDockAreaLayoutItem>::operator=
              ((QList<QDockAreaLayoutItem> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),args);
    in_stack_fffffffffffffeb0 = (iterator)&stack0xfffffffffffffff8;
    do {
      in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeb0 + -1;
      QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_fffffffffffffeb0);
      animate = (undefined1)((ulong)in_RSI >> 0x38);
    } while (in_stack_fffffffffffffeb0 != &local_30);
    in_stack_fffffffffffffea8 = *(undefined4 *)&pQVar4[9].field_0x4;
    QVar5 = QRect::size((QRect *)in_stack_fffffffffffffeb0);
    in_stack_ffffffffffffff4c = QVar5.wd.m_i;
    in_stack_ffffffffffffff50 = QVar5.ht.m_i;
    in_stack_fffffffffffffeac =
         pick((Orientation)((ulong)in_stack_fffffffffffffea0 >> 0x20),
              (QSize *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    pQVar6 = QList<QDockAreaLayoutItem>::first
                       ((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffea0);
    pQVar6->size = in_stack_fffffffffffffeac;
    local_48 = 0;
    local_40 = 0;
  }
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  dockWidgetItem = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutInfo::gapIndex
            (this_00,in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
             (TabMode)in_stack_fffffffffffffee8);
  cVar2 = QList<int>::operator==
                    ((QList<int> *)in_RDI,(QList<int> *)CONCAT17(uVar7,in_stack_fffffffffffffed0));
  if ((cVar2) ||
     (bVar1 = QDockAreaLayoutInfo::hasGapItem
                        (in_stack_fffffffffffffeb8,(QList<int> *)in_stack_fffffffffffffeb0), bVar1))
  {
    local_d5 = false;
  }
  else {
    QList<int>::operator=
              ((QList<int> *)in_stack_fffffffffffffea0,
               (QList<int> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QDockAreaLayoutInfo::insertGap
              ((QDockAreaLayoutInfo *)
               CONCAT44(in_stack_ffffffffffffff54.i,in_stack_ffffffffffffff50.m_i),
               (QList<int> *)CONCAT44(in_stack_ffffffffffffff4c.m_i,in_stack_ffffffffffffff48),
               dockWidgetItem);
    QDockAreaLayoutInfo::fitItems(this_02);
    layoutInfo((QDockWidgetGroupWindow *)0x5f1f79);
    QDockAreaLayoutInfo::operator=
              (in_stack_fffffffffffffea0,
               (QDockAreaLayoutInfo *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
    ;
    updateCurrentGapRect
              ((QDockWidgetGroupWindow *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffea0 = layoutInfo((QDockWidgetGroupWindow *)0x5f1f9d);
    local_d4.super_QFlagsStorage<QMainWindow::DockOption>.i =
         (QFlagsStorage<QMainWindow::DockOption>)
         QFlags<QMainWindow::DockOption>::operator&
                   ((QFlags<QMainWindow::DockOption> *)in_stack_fffffffffffffea0,
                    in_stack_fffffffffffffe9c);
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d4);
    QDockAreaLayoutInfo::apply(this_01,(bool)animate);
    local_d5 = true;
  }
  QList<int>::~QList((QList<int> *)0x5f1ffb);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(in_stack_fffffffffffffea0);
  if (*(QLayoutItem **)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d5;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetGroupWindow::hover(QLayoutItem *widgetItem, const QPoint &mousePos)
{
    QDockAreaLayoutInfo &savedState = static_cast<QDockWidgetGroupLayout *>(layout())->savedState;
    if (savedState.isEmpty())
        savedState = *layoutInfo();

    QMainWindow::DockOptions opts = static_cast<QMainWindow *>(parentWidget())->dockOptions();
    QDockAreaLayoutInfo newState = savedState;
    bool nestingEnabled =
        (opts & QMainWindow::AllowNestedDocks) && !(opts & QMainWindow::ForceTabbedDocks);
    QDockAreaLayoutInfo::TabMode tabMode =
#if !QT_CONFIG(tabbar)
        QDockAreaLayoutInfo::NoTabs;
#else
        nestingEnabled ? QDockAreaLayoutInfo::AllowTabs : QDockAreaLayoutInfo::ForceTabs;
    if (auto group = qobject_cast<QDockWidgetGroupWindow *>(widgetItem->widget())) {
        if (!group->tabLayoutInfo())
            tabMode = QDockAreaLayoutInfo::NoTabs;
    }
    if (newState.tabbed) {
        // insertion into a top-level tab
        newState.item_list = { QDockAreaLayoutItem(new QDockAreaLayoutInfo(newState)) };
        newState.item_list.first().size = pick(savedState.o, savedState.rect.size());
        newState.tabbed = false;
        newState.tabBar = nullptr;
    }
#endif

    auto newGapPos = newState.gapIndex(mousePos, nestingEnabled, tabMode);
    Q_ASSERT(!newGapPos.isEmpty());

    // Do not insert a new gap item, if the current position already is a gap,
    // or if the group window contains one
    if (newGapPos == currentGapPos || newState.hasGapItem(newGapPos))
        return false;

    currentGapPos = newGapPos;
    newState.insertGap(currentGapPos, widgetItem);
    newState.fitItems();
    *layoutInfo() = std::move(newState);
    updateCurrentGapRect();
    layoutInfo()->apply(opts & QMainWindow::AnimatedDocks);
    return true;
}